

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

bool __thiscall bssl::TemporaryFile::Init(TemporaryFile *this,Span<const_unsigned_char> content)

{
  bool bVar1;
  ulong uVar2;
  char *__template;
  uchar *__ptr;
  size_t __size;
  FILE *__s;
  size_t sVar3;
  undefined1 local_88 [8];
  ScopedFILE file;
  int fd;
  undefined1 local_70 [8];
  string path;
  undefined1 local_48 [8];
  string temp_dir;
  TemporaryFile *this_local;
  Span<const_unsigned_char> content_local;
  
  content_local.data_ = (uchar *)content.size_;
  this_local = (TemporaryFile *)content.data_;
  temp_dir.field_2._8_8_ = this;
  GetTempDir_abi_cxx11_();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    content_local.size_._7_1_ = 0;
    path.field_2._12_4_ = 1;
    goto LAB_002b6f26;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 "bssl_tmp_file.XXXXXX");
  __template = (char *)std::__cxx11::string::data();
  file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl._0_4_ = mkstemp(__template);
  if ((int)file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
           super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.
           super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl < 0) {
    perror("Could not create temporary file");
    content_local.size_._7_1_ = 0;
    path.field_2._12_4_ = 1;
  }
  else {
    close((int)file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
               super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.
               super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    std::__cxx11::string::operator=((string *)this,(string *)local_70);
    Open((TemporaryFile *)local_88,(char *)this);
    bVar1 = std::operator==((unique_ptr<_IO_FILE,_bssl::FileDeleter> *)local_88,(nullptr_t)0x0);
    if (bVar1) {
      perror("Could not open temporary file");
      content_local.size_._7_1_ = 0;
    }
    else {
      bVar1 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&this_local);
      if (!bVar1) {
        __ptr = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&this_local);
        __size = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
        __s = (FILE *)std::unique_ptr<_IO_FILE,_bssl::FileDeleter>::get
                                ((unique_ptr<_IO_FILE,_bssl::FileDeleter> *)local_88);
        sVar3 = fwrite(__ptr,__size,1,__s);
        if (sVar3 != 1) {
          perror("Could not write temporary file");
          content_local.size_._7_1_ = 0;
          goto LAB_002b6f07;
        }
      }
      content_local.size_._7_1_ = 1;
    }
LAB_002b6f07:
    path.field_2._12_4_ = 1;
    std::unique_ptr<_IO_FILE,_bssl::FileDeleter>::~unique_ptr
              ((unique_ptr<_IO_FILE,_bssl::FileDeleter> *)local_88);
  }
  std::__cxx11::string::~string((string *)local_70);
LAB_002b6f26:
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(content_local.size_._7_1_ & 1);
}

Assistant:

bool TemporaryFile::Init(bssl::Span<const uint8_t> content) {
  std::string temp_dir = GetTempDir();
  if (temp_dir.empty()) {
    return false;
  }

#if defined(OPENSSL_WINDOWS)
  char path[MAX_PATH];
  if (GetTempFileNameA(temp_dir.c_str(), "bssl",
                       /*uUnique=*/0, path) == 0) {
    PrintLastError("Could not create temporary");
    return false;
  }
  path_ = path;
#else
  std::string path = temp_dir + "bssl_tmp_file.XXXXXX";
  int fd = mkstemp(path.data());
  if (fd < 0) {
    perror("Could not create temporary file");
    return false;
  }
  close(fd);
  path_ = std::move(path);
#endif

  ScopedFILE file = Open("wb");
  if (file == nullptr) {
    perror("Could not open temporary file");
    return false;
  }
  if (!content.empty() &&
      fwrite(content.data(), content.size(), /*nitems=*/1, file.get()) != 1) {
    perror("Could not write temporary file");
    return false;
  }
  return true;
}